

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::basic_substring<const_char>::first_not_of
          (basic_substring<const_char> *this,ro_substr chars,size_t start)

{
  error_flags eVar1;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar2;
  size_t j;
  bool gotit;
  size_t i;
  ulong local_50;
  ulong local_40;
  
  bVar2 = true;
  if (((ulong)in_RDI[1] < in_RCX) && (bVar2 = false, in_RCX == in_RDI[1])) {
    bVar2 = in_RDI[1] == 0;
  }
  local_40 = in_RCX;
  if (!bVar2) {
    eVar1 = get_error_flags();
    if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    handle_error(0x347f4b,(char *)0x1756,"check failed: %s",
                 "(start >= 0 && start <= len) || (start == len && len == 0)");
  }
  do {
    if ((ulong)in_RDI[1] <= local_40) {
      return 0xffffffffffffffff;
    }
    bVar2 = true;
    for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 1) {
      if (*(char *)(*in_RDI + local_40) == *(char *)(in_RSI + local_50)) {
        bVar2 = false;
        break;
      }
    }
    if (bVar2) {
      return local_40;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

size_t first_not_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT((start >= 0 && start <= len) || (start == len && len == 0));
        for(size_t i = start; i < len; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }